

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

float rsg::VariableWrite::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  VariableManager *pVVar1;
  bool bVar2;
  pointer ppVVar3;
  float fVar4;
  IsWritableSupersetEntry local_38;
  
  bVar2 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
  fVar4 = 1.0;
  if (!bVar2) {
    pVVar1 = state->m_varManager;
    local_38.m_valueRange.m_max = valueRange.m_max;
    local_38.m_valueRange.m_type = valueRange.m_type;
    local_38.m_valueRange.m_min = valueRange.m_min;
    ppVVar3 = (pVVar1->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppVVar3 !=
        (pVVar1->m_entryCache).
        super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar2 = anon_unknown_0::IsWritableSupersetEntry::operator()(&local_38,*ppVVar3);
        if (bVar2) {
          return 1.0;
        }
        ppVVar3 = ppVVar3 + 1;
      } while (ppVVar3 !=
               (pVVar1->m_entryCache).
               super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fVar4 = 0.0;
  }
  return fVar4;
}

Assistant:

float VariableWrite::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableSupersetEntry(valueRange)))
		return 0.0f;
	else
		return 1.0f;
}